

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::MessageFactory::InternalRegisterGeneratedMessage
               (Descriptor *descriptor,Message *prototype)

{
  DescriptorPool *pDVar1;
  bool bVar2;
  GeneratedMessageFactory *pGVar3;
  DescriptorPool *pDVar4;
  LogMessage *pLVar5;
  LogFinisher local_61;
  Descriptor *local_60;
  Message *local_58;
  LogMessage local_50;
  
  pGVar3 = anon_unknown_0::GeneratedMessageFactory::singleton();
  pDVar1 = *(DescriptorPool **)(*(long *)(descriptor + 0x10) + 0x10);
  local_60 = descriptor;
  local_58 = prototype;
  pDVar4 = DescriptorPool::generated_pool();
  if (pDVar1 != pDVar4) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
               ,0x11e);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (descriptor->file()->pool()) == (DescriptorPool::generated_pool()): "
                       );
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,
                        "Tried to register a non-generated type with the generated type registry.");
    internal::LogFinisher::operator=(&local_61,pLVar5);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::Mutex::AssertHeld(&pGVar3->mutex_);
  bVar2 = InsertIfNotPresent<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>>,google::protobuf::Descriptor_const*,google::protobuf::Message_const*>
                    (&pGVar3->type_map_,&local_60,&local_58);
  if (!bVar2) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
               ,0x127);
    pLVar5 = internal::LogMessage::operator<<(&local_50,"Type is already registered: ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,*(string **)(local_60 + 8));
    internal::LogFinisher::operator=(&local_61,pLVar5);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedMessage(
    const Descriptor* descriptor, const Message* prototype) {
  GeneratedMessageFactory::singleton()->RegisterType(descriptor, prototype);
}